

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

void __thiscall test_get_rows_back::initialize_tensors(test_get_rows_back *this,ggml_context *ctx)

{
  void *pvVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> data;
  ggml_tensor *in_stack_ffffffffffffffa8;
  allocator_type local_49;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  pointer local_38;
  
  piVar3 = (int *)ggml_get_first_tensor(ctx);
  if (piVar3 != (int *)0x0) {
    do {
      if (*piVar3 == 0x1a) {
        if (3 < piVar3[0x14] - 0x22U) {
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb8,
                     (long)this->b * (long)this->r,&local_49);
          lVar4 = (long)this->b * (long)this->r;
          if ((int)lVar4 < 1) {
            lVar6 = CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
          }
          else {
            lVar5 = 0;
            do {
              iVar2 = rand();
              lVar6 = CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
              *(int *)(lVar6 + lVar5 * 4) = iVar2 % this->m;
              lVar5 = lVar5 + 1;
              lVar4 = (long)this->b * (long)this->r;
            } while (lVar5 < lVar4);
          }
          ggml_backend_tensor_set(piVar3,lVar6,0,lVar4 << 2);
          pvVar1 = (void *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
          if (pvVar1 != (void *)0x0) {
            operator_delete(pvVar1,(long)local_38 - (long)pvVar1);
          }
        }
      }
      else {
        init_tensor_uniform(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb8);
      }
      piVar3 = (int *)ggml_get_next_tensor(ctx,piVar3);
    } while (piVar3 != (int *)0x0);
  }
  return;
}

Assistant:

void initialize_tensors(ggml_context * ctx) override {
        for (ggml_tensor * t = ggml_get_first_tensor(ctx); t != NULL; t = ggml_get_next_tensor(ctx, t)) {
            if (t->type == GGML_TYPE_I32) {
                if (ggml_is_view_op(t->op)) { continue; }
                // rows
                std::vector<int> data(r*b);
                for (int i = 0; i < r*b; i++) {
                    data[i] = rand() % m;
                }
                ggml_backend_tensor_set(t, data.data(), 0, r * b * sizeof(int));
            } else {
                init_tensor_uniform(t);
            }
        }
    }